

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O2

libssh2_knownhost * knownhost_to_external(known_host *node)

{
  int iVar1;
  char *pcVar2;
  
  (node->external).magic = 0xdeadcafe;
  (node->external).node = node;
  iVar1 = node->typemask;
  if ((short)iVar1 == 1) {
    pcVar2 = node->name;
  }
  else {
    pcVar2 = (char *)0x0;
  }
  (node->external).name = pcVar2;
  (node->external).key = node->key;
  (node->external).typemask = iVar1;
  return &node->external;
}

Assistant:

static struct libssh2_knownhost *knownhost_to_external(struct known_host *node)
{
    struct libssh2_knownhost *ext = &node->external;

    ext->magic = KNOWNHOST_MAGIC;
    ext->node = node;
    ext->name = ((node->typemask & LIBSSH2_KNOWNHOST_TYPE_MASK) ==
                 LIBSSH2_KNOWNHOST_TYPE_PLAIN) ? node->name : NULL;
    ext->key = node->key;
    ext->typemask = node->typemask;

    return ext;
}